

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_Buffer.cc
# Opt level: O2

string * __thiscall Pl_Buffer::getString_abi_cxx11_(string *__return_storage_ptr__,Pl_Buffer *this)

{
  Members *pMVar1;
  logic_error *this_00;
  
  pMVar1 = (this->m)._M_t.
           super___uniq_ptr_impl<Pl_Buffer::Members,_std::default_delete<Pl_Buffer::Members>_>._M_t.
           super__Tuple_impl<0UL,_Pl_Buffer::Members_*,_std::default_delete<Pl_Buffer::Members>_>.
           super__Head_base<0UL,_Pl_Buffer::Members_*,_false>._M_head_impl;
  if (pMVar1->ready != false) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&pMVar1->data);
    pMVar1 = (this->m)._M_t.
             super___uniq_ptr_impl<Pl_Buffer::Members,_std::default_delete<Pl_Buffer::Members>_>.
             _M_t.
             super__Tuple_impl<0UL,_Pl_Buffer::Members_*,_std::default_delete<Pl_Buffer::Members>_>.
             super__Head_base<0UL,_Pl_Buffer::Members_*,_false>._M_head_impl;
    (pMVar1->data)._M_string_length = 0;
    *(pMVar1->data)._M_dataplus._M_p = '\0';
    return __return_storage_ptr__;
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error(this_00,"Pl_Buffer::getString() called when not ready");
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

std::string
Pl_Buffer::getString()
{
    if (!m->ready) {
        throw std::logic_error("Pl_Buffer::getString() called when not ready");
    }
    auto s = std::move(m->data);
    m->data.clear();
    return s;
}